

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool SQCompilation::isIndeterminated(Expr *e)

{
  TreeOp TVar1;
  int iVar2;
  TerExpr *this;
  Node *pNVar3;
  undefined4 extraout_var;
  void *extraout_RDX;
  void *in_RSI;
  Expr *elseE;
  Expr *thenE;
  TerExpr *ter;
  Expr *rhs;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_1;
  
  this = (TerExpr *)
         deparen((Expr *)CONCAT17(in_stack_ffffffffffffffcf,
                                  CONCAT16(in_stack_ffffffffffffffce,
                                           CONCAT15(in_stack_ffffffffffffffcd,
                                                    in_stack_ffffffffffffffc8))));
  TVar1 = Node::op((Node *)this);
  if (TVar1 == TO_NULLC) {
    pNVar3 = &BinExpr::rhs((BinExpr *)this)->super_Node;
    TVar1 = Node::op(pNVar3);
    local_1 = true;
    if (TVar1 != TO_ARRAYEXPR) {
      TVar1 = Node::op(pNVar3);
      local_1 = TVar1 == TO_DECL_EXPR;
    }
  }
  else {
    TVar1 = Node::op((Node *)this);
    if (TVar1 == TO_TERNARY) {
      pNVar3 = &TerExpr::b(this)->super_Node;
      iVar2 = TerExpr::c(this,in_RSI,extraout_RDX);
      TVar1 = Node::op(pNVar3);
      local_1 = true;
      if (TVar1 != TO_ARRAYEXPR) {
        TVar1 = Node::op(pNVar3);
        local_1 = true;
        if (TVar1 != TO_DECL_EXPR) {
          TVar1 = Node::op((Node *)CONCAT44(extraout_var,iVar2));
          local_1 = true;
          if (TVar1 != TO_ARRAYEXPR) {
            TVar1 = Node::op((Node *)CONCAT44(extraout_var,iVar2));
            local_1 = TVar1 == TO_DECL_EXPR;
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool isIndeterminated(const Expr *e) {
  e = deparen(e);

  if (e->op() == TO_NULLC) { // -V522
    const Expr *rhs = static_cast<const BinExpr *>(e)->rhs(); // -V522
    return rhs->op() == TO_ARRAYEXPR || rhs->op() == TO_DECL_EXPR;
  }

  if (e->op() == TO_TERNARY) {  // -V522
    const TerExpr *ter = static_cast<const TerExpr *>(e);
    const Expr *thenE = ter->b(); // -V522
    const Expr *elseE = ter->c(); // -V522

    return (thenE->op() == TO_ARRAYEXPR || thenE->op() == TO_DECL_EXPR) || (elseE->op() == TO_ARRAYEXPR || elseE->op() == TO_DECL_EXPR);
  }

  return false;
}